

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

void __thiscall notch::io::LayerSpec::LayerSpec(LayerSpec *this,ABackpropLayer *layer)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  invalid_argument *this_00;
  bool local_189;
  string local_140 [32];
  string local_120 [32];
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  undefined8 *local_f0;
  Activation *af_1;
  valarray<float> local_d8;
  shared_ptr<const_std::valarray<float>_> local_c8;
  valarray<float> local_b8;
  string local_a8 [32];
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  undefined8 *local_78;
  Activation *af;
  undefined1 local_68 [6];
  bool hasActivation;
  shared_ptr<const_std::valarray<float>_> local_58;
  byte local_45;
  bool hasParameters;
  string local_38 [8];
  string tag;
  ABackpropLayer *layer_local;
  LayerSpec *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->inputDim = 0;
  this->outputDim = 0;
  core::std::
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  shared_ptr(&this->activation,(nullptr_t)0x0);
  core::std::shared_ptr<std::valarray<float>_>::shared_ptr(&this->weights,(nullptr_t)0x0);
  core::std::shared_ptr<std::valarray<float>_>::shared_ptr(&this->bias,(nullptr_t)0x0);
  (**layer->_vptr_ABackpropLayer)(local_38);
  std::__cxx11::string::operator=((string *)this,local_38);
  iVar2 = (*layer->_vptr_ABackpropLayer[1])();
  this->inputDim = CONCAT44(extraout_var,iVar2);
  iVar2 = (*layer->_vptr_ABackpropLayer[2])();
  this->outputDim = CONCAT44(extraout_var_00,iVar2);
  af._7_1_ = 0;
  (*layer->_vptr_ABackpropLayer[6])(&local_58);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_58);
  local_189 = false;
  if (bVar1) {
    (*layer->_vptr_ABackpropLayer[7])(local_68);
    af._7_1_ = 1;
    local_189 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_68);
  }
  if ((af._7_1_ & 1) != 0) {
    core::std::shared_ptr<const_std::valarray<float>_>::~shared_ptr
              ((shared_ptr<const_std::valarray<float>_> *)local_68);
  }
  core::std::shared_ptr<const_std::valarray<float>_>::~shared_ptr(&local_58);
  local_45 = local_189;
  af._6_1_ = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_38,"ActivationLayer");
  if ((local_45 & 1) == 0) {
    if (!(bool)af._6_1_) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+((char *)local_140,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "unsupported layer type: ");
      std::invalid_argument::invalid_argument(this_00,local_140);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    iVar2 = (*layer->_vptr_ABackpropLayer[10])();
    local_f0 = (undefined8 *)CONCAT44(extraout_var_02,iVar2);
    (**(code **)*local_f0)(local_120);
    std::make_shared<std::__cxx11::string,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100);
    core::std::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&this->activation,&local_100);
    core::std::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~shared_ptr(&local_100);
    std::__cxx11::string::~string(local_120);
  }
  else {
    iVar2 = (*layer->_vptr_ABackpropLayer[10])();
    local_78 = (undefined8 *)CONCAT44(extraout_var_01,iVar2);
    (**(code **)*local_78)(local_a8);
    std::make_shared<std::__cxx11::string,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88);
    core::std::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&this->activation,&local_88);
    core::std::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~shared_ptr(&local_88);
    std::__cxx11::string::~string(local_a8);
    (*layer->_vptr_ABackpropLayer[6])(&local_c8);
    core::std::
    __shared_ptr_access<const_std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)&local_c8);
    std::make_shared<std::valarray<float>,std::valarray<float>const&>(&local_b8);
    core::std::shared_ptr<std::valarray<float>_>::operator=
              (&this->weights,(shared_ptr<std::valarray<float>_> *)&local_b8);
    core::std::shared_ptr<std::valarray<float>_>::~shared_ptr
              ((shared_ptr<std::valarray<float>_> *)&local_b8);
    core::std::shared_ptr<const_std::valarray<float>_>::~shared_ptr(&local_c8);
    (*layer->_vptr_ABackpropLayer[7])(&af_1);
    core::std::
    __shared_ptr_access<const_std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)&af_1);
    std::make_shared<std::valarray<float>,std::valarray<float>const&>(&local_d8);
    core::std::shared_ptr<std::valarray<float>_>::operator=
              (&this->bias,(shared_ptr<std::valarray<float>_> *)&local_d8);
    core::std::shared_ptr<std::valarray<float>_>::~shared_ptr
              ((shared_ptr<std::valarray<float>_> *)&local_d8);
    core::std::shared_ptr<const_std::valarray<float>_>::~shared_ptr
              ((shared_ptr<const_std::valarray<float>_> *)&af_1);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

LayerSpec(const ABackpropLayer &layer) {
        std::string tag = layer.tag();
        this->tag = tag;
        this->inputDim = layer.inputDim();
        this->outputDim = layer.outputDim();
        // TODO: implement LayerSpec for layers with only weights or bias
        bool hasParameters = layer.getWeights() && layer.getBias();
        bool hasActivation = tag == "ActivationLayer";
        if (hasParameters) {
            auto &af = layer.getActivation();
            activation = std::make_shared<std::string>(af.tag());
            weights = std::make_shared<Array>(*layer.getWeights());
            bias = std::make_shared<Array>(*layer.getBias());
        } else if (hasActivation) {
            auto &af = layer.getActivation();
            activation = std::make_shared<std::string>(af.tag());
        } else {
            throw std::invalid_argument("unsupported layer type: " + tag);
        }
    }